

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::ConvertToSampledImagePass::CreateImageExtraction
          (ConvertToSampledImagePass *this,Instruction *sampled_image)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t operand1;
  TypeManager *this_00;
  Type *pTVar3;
  undefined4 extraout_var;
  Instruction *pIVar4;
  Instruction *insert_before;
  InstructionBuilder builder;
  
  pIVar4 = (sampled_image->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  insert_before = (Instruction *)0x0;
  if ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
    insert_before = pIVar4;
  }
  InstructionBuilder::InstructionBuilder
            (&builder,(this->super_Pass).context_,insert_before,
             kAnalysisInstrToBlockMapping|kAnalysisBegin);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  uVar1 = Instruction::type_id(sampled_image);
  pTVar3 = analysis::TypeManager::GetType(this_00,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[0x15])(pTVar3);
  uVar1 = analysis::TypeManager::GetTypeInstruction
                    (this_00,*(Type **)(CONCAT44(extraout_var,iVar2) + 0x28));
  operand1 = Instruction::result_id(sampled_image);
  pIVar4 = InstructionBuilder::AddUnaryOp(&builder,uVar1,OpImage,operand1);
  return pIVar4;
}

Assistant:

Instruction* ConvertToSampledImagePass::CreateImageExtraction(
    Instruction* sampled_image) {
  InstructionBuilder builder(
      context(), sampled_image->NextNode(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  return builder.AddUnaryOp(
      GetImageTypeOfSampledImage(context()->get_type_mgr(), sampled_image),
      spv::Op::OpImage, sampled_image->result_id());
}